

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Function * __thiscall
soul::StructuralParser::parseFunctionDeclaration
          (StructuralParser *this,Context *context,Expression *returnType,Identifier name,
          Context *nameLocation,
          vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          *genericWildcards)

{
  Scope *newScope;
  Scope *pSVar1;
  SourceCodeText *pSVar2;
  SourceCodeText *o;
  pointer ppVar3;
  Allocator *pAVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  Handle handle;
  IntrinsicType IVar10;
  Function *pFVar11;
  Expression *pEVar12;
  undefined4 extraout_var;
  PoolItem *pPVar13;
  Identifier IVar14;
  Property *pPVar15;
  Block *pBVar16;
  pool_ref<soul::AST::UnqualifiedName> *w;
  pointer ppVar17;
  string_view s;
  string_view sVar18;
  Context typeLocation;
  Context local_110;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *local_f8;
  undefined1 local_f0 [32];
  Ptr local_d0;
  _Alloc_hider local_b8;
  pool_ptr<soul::AST::Expression> local_b0;
  pool_ptr<soul::AST::Function> local_a8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_f8 = genericWildcards;
  if (returnType->kind == type) {
    iVar9 = (*(returnType->super_Statement).super_ASTObject._vptr_ASTObject[3])(returnType);
    if ((char)iVar9 != '\0') {
      iVar9 = (*(returnType->super_Statement).super_ASTObject._vptr_ASTObject[10])(returnType);
      if (iVar9 == 0) {
        CompileMessageHelpers::createMessage<>
                  ((CompileMessage *)local_f0,syntax,error,"Function return type cannot be const");
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)local_f0);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d0.object);
        if ((SourceCodeText *)local_f0._0_8_ != (SourceCodeText *)(local_f0 + 0x10)) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
        }
      }
    }
  }
  pFVar11 = PoolAllocator::allocate<soul::AST::Function,soul::AST::Context_const&>
                      (&this->allocator->pool,context);
  newScope = &pFVar11->super_Scope;
  pSVar1 = this->currentScope;
  this->currentScope = newScope;
  (pFVar11->name).name = name.name;
  pSVar2 = (nameLocation->location).sourceCode.object;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  o = (pFVar11->nameLocation).location.sourceCode.object;
  (pFVar11->nameLocation).location.sourceCode.object = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  uVar5 = *(undefined4 *)((long)&(nameLocation->location).location.data + 4);
  uVar6 = *(undefined4 *)&nameLocation->parentScope;
  uVar7 = *(undefined4 *)((long)&nameLocation->parentScope + 4);
  *(undefined4 *)&(pFVar11->nameLocation).location.location.data =
       *(undefined4 *)&(nameLocation->location).location.data;
  *(undefined4 *)((long)&(pFVar11->nameLocation).location.location.data + 4) = uVar5;
  *(undefined4 *)&(pFVar11->nameLocation).parentScope = uVar6;
  *(undefined4 *)((long)&(pFVar11->nameLocation).parentScope + 4) = uVar7;
  (pFVar11->returnType).object = returnType;
  std::
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ::_M_move_assign(&pFVar11->genericWildcards,local_f8);
  pEVar12 = (pFVar11->returnType).object;
  if (pEVar12 != (Expression *)0x0) {
    recursivelyReplaceParentScope(pEVar12,newScope);
  }
  ppVar3 = (pFVar11->genericWildcards).
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar17 = (pFVar11->genericWildcards).
                 super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar17 != ppVar3; ppVar17 = ppVar17 + 1
      ) {
    recursivelyReplaceParentScope(&ppVar17->object->super_Expression,newScope);
  }
  bVar8 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
  if (!bVar8) {
    do {
      giveErrorOnExternalKeyword(this);
      local_f0._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
      if ((SourceCodeText *)local_f0._0_8_ != (SourceCodeText *)0x0) {
        (((SourceCodeText *)local_f0._0_8_)->super_RefCountedObject).refCount =
             (((SourceCodeText *)local_f0._0_8_)->super_RefCountedObject).refCount + 1;
      }
      local_f0._8_8_ = (this->super_SOULTokeniser).location.location.data;
      local_f0._16_8_ = this->currentScope;
      pEVar12 = parseType(this,functionParameter);
      iVar9 = (*(pEVar12->super_Statement).super_ASTObject._vptr_ASTObject[0xb])(pEVar12);
      if ((CONCAT44(extraout_var,iVar9) != 0) && (*(int *)(CONCAT44(extraout_var,iVar9) + 4) == 1))
      {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Function parameters cannot be void");
        AST::Context::throwError((Context *)local_f0,&local_68,false);
      }
      if (0x3f8 < (ulong)((long)(pFVar11->parameters).
                                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pFVar11->parameters).
                               super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Too many function parameters");
        AST::Context::throwError((Context *)local_f0,&local_a0,false);
      }
      local_110.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
      if (local_110.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_110.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_110.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_110.location.location.data = (this->super_SOULTokeniser).location.location.data;
      local_110.parentScope = this->currentScope;
      pPVar13 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x78);
      local_b8._M_p = (pointer)0x0;
      local_b0.object = pEVar12;
      AST::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)&pPVar13->item,&local_110,&local_b0,
                 (pool_ptr<soul::AST::Expression> *)&local_b8,false);
      pPVar13->destructor =
           PoolAllocator::
           allocate<soul::AST::VariableDeclaration,_soul::AST::Context,_soul::AST::Expression_&,_std::nullptr_t,_bool>
           ::anon_class_1_0_00000001::__invoke;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_110.location.sourceCode.object);
      local_110.location.sourceCode.object = (SourceCodeText *)&pPVar13->item;
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
                ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
                  *)&pFVar11->parameters,(pool_ref<soul::AST::VariableDeclaration> *)&local_110);
      *(undefined1 *)&pPVar13[3].destructor = 1;
      IVar14 = parseIdentifier(this);
      *(string **)&pPVar13[1].field_0x18 = IVar14.name;
      bVar8 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
      if (!bVar8) {
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fab);
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_f0._0_8_);
    } while (!bVar8);
  }
  parseAnnotation(this,&pFVar11->annotation);
  pPVar15 = AST::Annotation::findProperty<char[7]>(&pFVar11->annotation,(char (*) [7])"intrin");
  if (pPVar15 != (Property *)0x0) {
    (*(((pPVar15->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(local_f0);
    if (((SourceCodeText *)local_f0._0_8_ != (SourceCodeText *)0x0) &&
       ((char)*(size_type *)(local_f0._0_8_ + 0x30) == '\a')) {
      pAVar4 = this->allocator;
      handle = soul::Value::getStringLiteral((Value *)(local_f0._0_8_ + 0x30));
      sVar18 = StringDictionary::getStringForHandle(&pAVar4->stringDictionary,handle);
      s._M_str = sVar18._M_str;
      s._M_len = (size_t)s._M_str;
      IVar10 = getIntrinsicTypeFromName((soul *)sVar18._M_len,s);
      pFVar11->intrinsic = IVar10;
      if (IVar10 == none) {
        throwInternalCompilerError
                  ("f.intrinsic != IntrinsicType::none","parseFunctionDeclaration",0x436);
      }
    }
  }
  bVar8 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
  if (!bVar8) {
    local_a8.object = pFVar11;
    pBVar16 = parseBracedBlock(this,&local_a8);
    (pFVar11->block).object = pBVar16;
  }
  this->currentScope = pSVar1;
  return pFVar11;
}

Assistant:

AST::Function& parseFunctionDeclaration (const AST::Context& context, AST::Expression& returnType,
                                             Identifier name, const AST::Context& nameLocation,
                                             std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards)
    {
        if (AST::isResolvedAsType (returnType) && returnType.getConstness() == AST::Constness::definitelyConst)
            throwError (Errors::functionReturnTypeCannotBeConst());

        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        f.name = name;
        f.nameLocation = nameLocation;
        f.returnType = returnType;
        f.genericWildcards = std::move (genericWildcards);

        if (f.returnType != nullptr)
            recursivelyReplaceParentScope (*f.returnType, f);

        for (auto& w : f.genericWildcards)
            recursivelyReplaceParentScope (w, f);

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                giveErrorOnExternalKeyword();
                auto typeLocation = getContext();
                auto& type = parseType (ParseTypeContext::functionParameter);

                if (auto t = type.getConcreteType())
                    if (t->isVoid())
                        typeLocation.throwError (Errors::parameterCannotBeVoid());

                if (f.parameters.size() > 127)
                    typeLocation.throwError (Errors::tooManyParameters());

                auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
                f.parameters.push_back (v);
                v.isFunctionParameter = true;
                v.name = parseIdentifier();

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        parseAnnotation (f.annotation);

        if (auto intrin = f.annotation.findProperty ("intrin"))
        {
            if (auto c = intrin->value->getAsConstant())
            {
                if (c->value.getType().isStringLiteral())
                {
                    f.intrinsic = getIntrinsicTypeFromName (allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral()));
                    SOUL_ASSERT (f.intrinsic != IntrinsicType::none);
                }
            }
        }

        if (! matchIf (Operator::semicolon))
            f.block = parseBracedBlock (f);

        return f;
    }